

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::DefaultsTest::CheckValue<int>
          (DefaultsTest *this,int value,int reference_value,GLchar *pname_string,
          GLchar *function_string)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  MessageBuilder local_1b0;
  GLchar *local_30;
  GLchar *function_string_local;
  GLchar *pname_string_local;
  int reference_value_local;
  int value_local;
  DefaultsTest *this_local;
  
  if (reference_value != value) {
    local_30 = function_string;
    function_string_local = pname_string;
    pname_string_local._0_4_ = reference_value;
    pname_string_local._4_4_ = value;
    _reference_value_local = this;
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_1b0,&local_30);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [14])0x2a6b30c);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&function_string_local);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [26])" parameter name returned ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(int *)((long)&pname_string_local + 4));
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [7])0x2a6afaf);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(int *)&pname_string_local);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [15])0x2a6e9eb);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  return reference_value == value;
}

Assistant:

bool DefaultsTest::CheckValue(const T value, const T reference_value, const glw::GLchar* pname_string,
							  const glw::GLchar* function_string)
{
	if (reference_value != value)
	{
		/* Log. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << function_string << " called with "
											<< pname_string << " parameter name returned " << value << ", but "
											<< reference_value << " was expected." << tcu::TestLog::EndMessage;

		return false;
	}
	return true;
}